

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultVAOCase::iterate(DefaultVAOCase *this)

{
  ObjectTraits **this_00;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  char *description;
  CallLogWrapper gl;
  Enum<int,_2UL> local_1a8;
  Buffer buffer;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).m_context)->m_testCtx->m_log);
  gl.m_enableLog = true;
  switch(this->m_caseType) {
  case CASE_BIND_VERTEX_BUFFER:
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              (&buffer,((this->super_TestCase).m_context)->m_renderCtx);
    glu::CallLogWrapper::glBindVertexBuffer(&gl,0,buffer.super_ObjectWrapper.m_object,0,0);
    glu::ObjectWrapper::~ObjectWrapper(&buffer.super_ObjectWrapper);
    break;
  case CASE_VERTEX_ATTRIB_FORMAT:
    glu::CallLogWrapper::glVertexAttribFormat(&gl,0,4,0x1406,'\0',0);
    break;
  case CASE_VERTEX_ATTRIB_I_FORMAT:
    glu::CallLogWrapper::glVertexAttribIFormat(&gl,0,4,0x1404,0);
    break;
  case CASE_VERTEX_ATTRIB_BINDING:
    glu::CallLogWrapper::glVertexAttribBinding(&gl,0,0);
    break;
  case CASE_VERTEX_BINDING_DIVISOR:
    glu::CallLogWrapper::glVertexBindingDivisor(&gl,0,1);
  }
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar2 != 0x502) {
    buffer.super_ObjectWrapper.m_gl =
         (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &buffer.super_ObjectWrapper.m_traits;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"ERROR! Expected GL_INVALID_OPERATION, got ");
    local_1a8.m_getName = glu::getErrorName;
    local_1a8.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    description = "Invalid error";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(GVar2 != 0x502),
             description);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

DefaultVAOCase::IterateResult DefaultVAOCase::iterate (void)
{
	glw::GLenum			error	= 0;
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	gl.enableLogging(true);

	switch (m_caseType)
	{
		case CASE_BIND_VERTEX_BUFFER:
		{
			glu::Buffer buffer(m_context.getRenderContext());
			gl.glBindVertexBuffer(0, *buffer, 0, 0);
			break;
		}

		case CASE_VERTEX_ATTRIB_FORMAT:
			gl.glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, 0);
			break;

		case CASE_VERTEX_ATTRIB_I_FORMAT:
			gl.glVertexAttribIFormat(0, 4, GL_INT, 0);
			break;

		case CASE_VERTEX_ATTRIB_BINDING:
			gl.glVertexAttribBinding(0, 0);
			break;

		case CASE_VERTEX_BINDING_DIVISOR:
			gl.glVertexBindingDivisor(0, 1);
			break;

		default:
			DE_ASSERT(false);
	}

	error = gl.glGetError();

	if (error != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR! Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}